

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O0

void __thiscall itis::AVLTree<int>::display(AVLTree<int> *this)

{
  AVLTree<int> *this_local;
  
  printf("\n");
  if (this->root == (AVLTreeNode<int> *)0x0) {
    printf("Empty");
  }
  else {
    display(this,this->root,0,0);
  }
  printf("\n");
  return;
}

Assistant:

void AVLTree<T>::display() {
    printf("\n");
    if (root != nullptr) {
      display(root);
    } else {
      printf("Empty");
    }
    printf("\n");
  }